

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_color.c
# Opt level: O2

void TIFFXYZToRGB(TIFFCIELabToRGB *cielab,float X,float Y,float Z,uint32_t *r,uint32_t *g,
                 uint32_t *b)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  float fVar6;
  undefined4 in_EAX;
  uint uVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar9 = Z * (cielab->display).d_mat[0][2] +
          X * (cielab->display).d_mat[0][0] + Y * (cielab->display).d_mat[0][1];
  fVar10 = Z * (cielab->display).d_mat[1][2] +
           X * (cielab->display).d_mat[1][0] + Y * (cielab->display).d_mat[1][1];
  uVar3 = (cielab->display).d_Y0R;
  uVar4 = (cielab->display).d_Y0G;
  iVar8 = -(uint)((float)uVar3 < fVar9);
  auVar5._4_4_ = iVar8;
  auVar5._0_4_ = iVar8;
  auVar5._8_4_ = -(uint)((float)uVar4 < fVar10);
  auVar5._12_4_ = -(uint)((float)uVar4 < fVar10);
  uVar7 = movmskpd(in_EAX,auVar5);
  if ((uVar7 & 1) == 0) {
    fVar9 = (float)uVar3;
  }
  fVar11 = (cielab->display).d_mat[2][2] * Z +
           (cielab->display).d_mat[2][0] * X + (cielab->display).d_mat[2][1] * Y;
  if ((uVar7 & 2) == 0) {
    fVar10 = (float)uVar4;
  }
  fVar1 = (cielab->display).d_YCR;
  if (fVar1 <= fVar9) {
    fVar9 = fVar1;
  }
  fVar1 = (cielab->display).d_YCG;
  if (fVar1 <= fVar10) {
    fVar10 = fVar1;
  }
  fVar1 = (cielab->display).d_Y0B;
  if (fVar11 <= fVar1) {
    fVar11 = fVar1;
  }
  iVar8 = (int)((fVar9 - (float)uVar3) / cielab->rstep);
  if (cielab->range < iVar8) {
    iVar8 = cielab->range;
  }
  fVar6 = 0.5;
  fVar9 = 0.5;
  if (cielab->Yr2r[iVar8] <= 0.0) {
    fVar9 = -0.5;
  }
  fVar2 = (cielab->display).d_YCB;
  if (fVar2 <= fVar11) {
    fVar11 = fVar2;
  }
  *r = (uint32_t)(long)(fVar9 + cielab->Yr2r[iVar8]);
  iVar8 = (int)((fVar10 - (float)uVar4) / cielab->gstep);
  if (cielab->range < iVar8) {
    iVar8 = cielab->range;
  }
  fVar9 = 0.5;
  if (cielab->Yg2g[iVar8] <= 0.0) {
    fVar9 = -0.5;
  }
  *g = (uint32_t)(long)(fVar9 + cielab->Yg2g[iVar8]);
  iVar8 = (int)((fVar11 - fVar1) / cielab->bstep);
  if (cielab->range < iVar8) {
    iVar8 = cielab->range;
  }
  if (cielab->Yb2b[iVar8] <= 0.0) {
    fVar6 = -0.5;
  }
  *b = (uint32_t)(long)(fVar6 + cielab->Yb2b[iVar8]);
  uVar7 = (cielab->display).d_Vrwr;
  if (*r < uVar7) {
    uVar7 = *r;
  }
  *r = uVar7;
  uVar7 = (cielab->display).d_Vrwg;
  if (*g < uVar7) {
    uVar7 = *g;
  }
  *g = uVar7;
  uVar7 = (cielab->display).d_Vrwb;
  if (*b < uVar7) {
    uVar7 = *b;
  }
  *b = uVar7;
  return;
}

Assistant:

void TIFFXYZToRGB(TIFFCIELabToRGB *cielab, float X, float Y, float Z,
                  uint32_t *r, uint32_t *g, uint32_t *b)
{
    int i;
    float Yr, Yg, Yb;
    float *matrix = &cielab->display.d_mat[0][0];

    /* Multiply through the matrix to get luminosity values. */
    Yr = matrix[0] * X + matrix[1] * Y + matrix[2] * Z;
    Yg = matrix[3] * X + matrix[4] * Y + matrix[5] * Z;
    Yb = matrix[6] * X + matrix[7] * Y + matrix[8] * Z;

    /* Clip input */
    Yr = TIFFmax(Yr, cielab->display.d_Y0R);
    Yg = TIFFmax(Yg, cielab->display.d_Y0G);
    Yb = TIFFmax(Yb, cielab->display.d_Y0B);

    /* Avoid overflow in case of wrong input values */
    Yr = TIFFmin(Yr, cielab->display.d_YCR);
    Yg = TIFFmin(Yg, cielab->display.d_YCG);
    Yb = TIFFmin(Yb, cielab->display.d_YCB);

    /* Turn luminosity to colour value. */
    i = (int)((Yr - cielab->display.d_Y0R) / cielab->rstep);
    i = TIFFmin(cielab->range, i);
    *r = RINT(cielab->Yr2r[i]);

    i = (int)((Yg - cielab->display.d_Y0G) / cielab->gstep);
    i = TIFFmin(cielab->range, i);
    *g = RINT(cielab->Yg2g[i]);

    i = (int)((Yb - cielab->display.d_Y0B) / cielab->bstep);
    i = TIFFmin(cielab->range, i);
    *b = RINT(cielab->Yb2b[i]);

    /* Clip output. */
    *r = TIFFmin(*r, cielab->display.d_Vrwr);
    *g = TIFFmin(*g, cielab->display.d_Vrwg);
    *b = TIFFmin(*b, cielab->display.d_Vrwb);
}